

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTreeWalkerImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMTreeWalkerImpl::getFirstChild(DOMTreeWalkerImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  short accept;
  DOMNode *newNode;
  DOMNode *node_local;
  DOMTreeWalkerImpl *this_local;
  
  if (node == (DOMNode *)0x0) {
    this_local = (DOMTreeWalkerImpl *)0x0;
  }
  else if (((this->fExpandEntityReferences & 1U) == 0) &&
          (iVar2 = (*node->_vptr_DOMNode[4])(), iVar2 == 5)) {
    this_local = (DOMTreeWalkerImpl *)0x0;
  }
  else {
    iVar2 = (*node->_vptr_DOMNode[7])();
    this_local = (DOMTreeWalkerImpl *)CONCAT44(extraout_var,iVar2);
    if (this_local == (DOMTreeWalkerImpl *)0x0) {
      this_local = (DOMTreeWalkerImpl *)0x0;
    }
    else {
      sVar1 = acceptNode(this,(DOMNode *)this_local);
      if (sVar1 != 1) {
        if ((sVar1 == 3) &&
           (uVar3 = (*(this_local->super_DOMTreeWalker)._vptr_DOMTreeWalker[0x12])(),
           (uVar3 & 1) != 0)) {
          this_local = (DOMTreeWalkerImpl *)getFirstChild(this,(DOMNode *)this_local);
        }
        else {
          this_local = (DOMTreeWalkerImpl *)getNextSibling(this,(DOMNode *)this_local);
        }
      }
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

DOMNode* DOMTreeWalkerImpl::getFirstChild (DOMNode* node) {

    if (!node) return 0;

    if(!fExpandEntityReferences && node->getNodeType()==DOMNode::ENTITY_REFERENCE_NODE)
        return 0;

    DOMNode* newNode = node->getFirstChild();
    if (!newNode)  return 0;

    short accept = acceptNode(newNode);

    if (accept == DOMNodeFilter::FILTER_ACCEPT)
        return newNode;
    else
    if (accept == DOMNodeFilter::FILTER_SKIP
        && newNode->hasChildNodes())
    {
        return getFirstChild(newNode);
    }
    return getNextSibling(newNode);

}